

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode
JsDefineProperty(JsValueRef object,JsPropertyIdRef propertyId,JsValueRef propertyDescriptor,
                bool *result)

{
  anon_class_32_4_18ba3b7b fn;
  JsErrorCode JVar1;
  bool *local_28;
  bool *result_local;
  JsValueRef propertyDescriptor_local;
  JsPropertyIdRef propertyId_local;
  JsValueRef object_local;
  
  fn.propertyId = &result_local;
  fn.object = &propertyDescriptor_local;
  fn.propertyDescriptor = &local_28;
  fn.result = (bool **)&propertyId_local;
  local_28 = result;
  result_local = (bool *)propertyDescriptor;
  propertyDescriptor_local = propertyId;
  propertyId_local = object;
  JVar1 = ContextAPIWrapper<false,JsDefineProperty::__0>(fn);
  return JVar1;
}

Assistant:

CHAKRA_API JsDefineProperty(_In_ JsValueRef object, _In_ JsPropertyIdRef propertyId,
    _In_ JsValueRef propertyDescriptor, _Out_ bool *result)
{
    return ContextAPIWrapper<JSRT_MAYBE_TRUE>([&] (Js::ScriptContext *scriptContext,
        TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION(scriptContext, RecordJsRTDefineProperty, object, (const Js::PropertyRecord *)propertyId, propertyDescriptor);

        VALIDATE_INCOMING_OBJECT(object, scriptContext);
        VALIDATE_INCOMING_PROPERTYID(propertyId);
        VALIDATE_INCOMING_OBJECT(propertyDescriptor, scriptContext);
        PARAM_NOT_NULL(result);
        *result = false;

        return JsDefinePropertyCommon(scriptContext, object, (const Js::PropertyRecord *)propertyId,
            propertyDescriptor, result);
    });
}